

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_biquad_init_preallocated(ma_biquad_config *pConfig,void *pHeap,ma_biquad *pBQ)

{
  ma_result mVar1;
  ulong uVar2;
  
  if (pBQ != (ma_biquad *)0x0) {
    pBQ->_pHeap = (void *)0x0;
    *(undefined8 *)&pBQ->_ownsHeap = 0;
    pBQ->pR1 = (ma_biquad_coefficient *)0x0;
    pBQ->pR2 = (ma_biquad_coefficient *)0x0;
    pBQ->b2 = (ma_biquad_coefficient)0x0;
    pBQ->a1 = (ma_biquad_coefficient)0x0;
    *(undefined8 *)&pBQ->a2 = 0;
    pBQ->format = ma_format_unknown;
    pBQ->channels = 0;
    pBQ->b0 = (ma_biquad_coefficient)0x0;
    pBQ->b1 = (ma_biquad_coefficient)0x0;
    if ((pConfig != (ma_biquad_config *)0x0) && (uVar2 = (ulong)pConfig->channels, uVar2 != 0)) {
      pBQ->_pHeap = pHeap;
      if (pHeap != (void *)0x0) {
        memset(pHeap,0,uVar2 << 3);
      }
      pBQ->pR1 = (ma_biquad_coefficient *)pHeap;
      pBQ->pR2 = (ma_biquad_coefficient *)(uVar2 * 4 + (long)pHeap);
      mVar1 = ma_biquad_reinit(pConfig,pBQ);
      return mVar1;
    }
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_biquad_init_preallocated(const ma_biquad_config* pConfig, void* pHeap, ma_biquad* pBQ)
{
    ma_result result;
    ma_biquad_heap_layout heapLayout;

    if (pBQ == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pBQ);

    result = ma_biquad_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pBQ->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pBQ->pR1 = (ma_biquad_coefficient*)ma_offset_ptr(pHeap, heapLayout.r1Offset);
    pBQ->pR2 = (ma_biquad_coefficient*)ma_offset_ptr(pHeap, heapLayout.r2Offset);

    return ma_biquad_reinit(pConfig, pBQ);
}